

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_slist *pcVar3;
  Curl_addrinfo *pCVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  Curl_addrinfo *pCVar9;
  void *pvVar10;
  Curl_dns_entry *pCVar11;
  uint *in_RCX;
  size_t buflen;
  char *__s;
  char *pcVar12;
  char *pcVar13;
  Curl_addrinfo *pCVar14;
  int port;
  char address [64];
  char hostname [256];
  char entry_id [262];
  uint local_29c;
  Curl_addrinfo *local_298;
  Curl_easy *local_290;
  char *local_288;
  char *local_280;
  char local_278 [64];
  char local_238 [256];
  char local_138 [264];
  
  local_29c = 0;
  puVar1 = &(data->state).field_0x6d2;
  *puVar1 = *puVar1 & 0xf7;
  pcVar3 = (data->state).resolve;
  local_290 = data;
  do {
    if (pcVar3 == (curl_slist *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    pcVar13 = pcVar3->data;
    if (pcVar13 != (char *)0x0) {
      cVar2 = *pcVar13;
      buflen = CONCAT71((int7)((ulong)in_RCX >> 8),cVar2);
      if (cVar2 != '-') {
        pcVar13 = pcVar13 + (cVar2 == '+');
        pcVar7 = strchr(pcVar13,0x3a);
        if (pcVar7 == (char *)0x0) {
          local_298 = (Curl_addrinfo *)0x0;
          pcVar13 = local_288;
          goto LAB_0054fb8f;
        }
        sVar6 = (long)pcVar7 - (long)pcVar13;
        if ((long)sVar6 < 0x100) {
          memcpy(local_238,pcVar13,sVar6);
          local_238[sVar6] = '\0';
          uVar8 = strtoul(pcVar7 + 1,&local_288,10);
          if ((((uVar8 < 0x10000) && (local_288 != pcVar7 + 1)) && (*local_288 == ':')) &&
             (local_29c = (uint)uVar8, *local_288 != '\0')) {
            local_280 = local_288 + 1;
            local_298 = (Curl_addrinfo *)0x0;
            pCVar14 = (Curl_addrinfo *)0x0;
            pcVar7 = local_288;
            do {
              __s = pcVar7 + 1;
              pcVar13 = strchr(__s,0x2c);
              if (pcVar13 == (char *)0x0) {
                sVar6 = strlen(__s);
                pcVar13 = __s + sVar6;
              }
              pcVar12 = pcVar13;
              data = local_290;
              if (*__s == '[') {
                if ((pcVar13 == __s) || (pcVar13[-1] != ']')) goto LAB_0054fb8f;
                __s = pcVar7 + 2;
                pcVar12 = pcVar13 + -1;
              }
              uVar8 = (long)pcVar12 - (long)__s;
              pCVar9 = pCVar14;
              pCVar4 = local_298;
              if (uVar8 != 0) {
                if (0x3f < uVar8) goto LAB_0054fb8f;
                memcpy(local_278,__s,uVar8);
                local_278[uVar8] = '\0';
                pCVar9 = Curl_str2addr(local_278,local_29c);
                data = local_290;
                if (pCVar9 == (Curl_addrinfo *)0x0) {
                  local_288 = pcVar13;
                  Curl_infof(local_290,"Resolve address \'%s\' found illegal",local_278);
                  pcVar13 = local_288;
                  goto LAB_0054fb8f;
                }
                pCVar4 = pCVar9;
                if (pCVar14 != (Curl_addrinfo *)0x0) {
                  pCVar14->ai_next = pCVar9;
                  pCVar4 = local_298;
                }
              }
              local_298 = pCVar4;
              pCVar14 = pCVar9;
              pcVar7 = pcVar13;
            } while (*pcVar13 != '\0');
            local_288 = pcVar13;
            if (local_298 != (Curl_addrinfo *)0x0) {
              create_hostcache_id(local_238,local_29c,local_138,buflen);
              sVar6 = strlen(local_138);
              data = local_290;
              if (local_290->share != (Curl_share *)0x0) {
                Curl_share_lock(local_290,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              pvVar10 = Curl_hash_pick((data->dns).hostcache,local_138,sVar6 + 1);
              if (pvVar10 != (void *)0x0) {
                Curl_infof(data,"RESOLVE %s:%d is - old addresses discarded",local_238,
                           (ulong)local_29c);
                Curl_hash_delete((data->dns).hostcache,local_138,sVar6 + 1);
              }
              pCVar11 = Curl_cache_addr(data,local_298,local_238,local_29c);
              if (pCVar11 != (Curl_dns_entry *)0x0) {
                if (cVar2 != '+') {
                  pCVar11->timestamp = 0;
                }
                pCVar11->inuse = pCVar11->inuse + -1;
              }
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
              if (pCVar11 == (Curl_dns_entry *)0x0) {
                Curl_freeaddrinfo(local_298);
                return CURLE_OUT_OF_MEMORY;
              }
              in_RCX = (uint *)(ulong)local_29c;
              pcVar13 = "";
              if (cVar2 == '+') {
                pcVar13 = " (non-permanent)";
              }
              Curl_infof(data,"Added %s:%d:%s to DNS cache%s",local_238,in_RCX,local_280,pcVar13);
              if ((local_238[0] == '*') && (local_238[1] == '\0')) {
                in_RCX = (uint *)(ulong)local_29c;
                Curl_infof(data,"RESOLVE %s:%d is wildcard, enabling wildcard checks",local_238,
                           in_RCX);
                puVar1 = &(data->state).field_0x6d2;
                *puVar1 = *puVar1 | 8;
              }
              goto LAB_0054fb3c;
            }
          }
        }
        local_298 = (Curl_addrinfo *)0x0;
        data = local_290;
        pcVar13 = local_288;
LAB_0054fb8f:
        local_288 = pcVar13;
        Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar3->data);
        Curl_freeaddrinfo(local_298);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }
      in_RCX = &local_29c;
      iVar5 = __isoc99_sscanf(pcVar13 + 1,"%255[^:]:%d",local_238);
      if (iVar5 == 2) {
        create_hostcache_id(local_238,local_29c,local_138,(size_t)in_RCX);
        sVar6 = strlen(local_138);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        Curl_hash_delete((data->dns).hostcache,local_138,sVar6 + 1);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
      }
      else {
        Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'",pcVar3->data);
      }
    }
LAB_0054fb3c:
    pcVar3 = pcVar3->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = false;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      bool permanent = TRUE;
      char *host_begin;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_begin = hostp->data;
      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end ||
         ((host_end - host_begin) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, host_begin, host_end - host_begin);
      hostname[host_end - host_begin] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it's already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %s:%d is - old addresses discarded",
              hostname, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, hostname, port);
      if(dns) {
        if(permanent)
          dns->timestamp = 0; /* mark as permanent */
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->inuse--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache%s",
            hostname, port, addresses, permanent ? "" : " (non-permanent)");

      /* Wildcard hostname */
      if(hostname[0] == '*' && hostname[1] == '\0') {
        infof(data, "RESOLVE %s:%d is wildcard, enabling wildcard checks",
              hostname, port);
        data->state.wildcard_resolve = true;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}